

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

bool duckdb::CheckIfParamIsEmpty
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *param
               )

{
  char cVar1;
  pointer pEVar2;
  BoundConstantExpression *pBVar3;
  type pBVar4;
  BinderException *this;
  templated_unique_single_t empty_list;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_e0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_d8;
  LogicalType local_b8 [24];
  undefined1 *local_a0 [2];
  undefined1 local_90 [48];
  Value local_60 [64];
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (param);
  if (pEVar2[0x38] == (Expression)0x65) {
    duckdb::LogicalType::LogicalType(local_b8,INTEGER);
    local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duckdb::Value::LIST(local_60,local_b8);
    pBVar3 = (BoundConstantExpression *)operator_new(0x98);
    duckdb::Value::Value((Value *)local_a0,local_60);
    duckdb::BoundConstantExpression::BoundConstantExpression(pBVar3,(Value *)local_a0);
    local_e0._M_head_impl = pBVar3;
    duckdb::Value::~Value((Value *)local_a0);
    duckdb::Value::~Value(local_60);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_d8);
    duckdb::LogicalType::~LogicalType(local_b8);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(param);
    pBVar4 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
             ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                          *)&local_e0);
    cVar1 = (**(code **)(*(long *)pEVar2 + 0x50))(pEVar2,pBVar4);
    if (cVar1 == '\0') {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"The upper and lower bounds of the slice must be a BIGINT","");
      duckdb::BinderException::BinderException(this,(string *)local_a0);
      __cxa_throw(this,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_e0._M_head_impl != (BoundConstantExpression *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  else {
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

static bool CheckIfParamIsEmpty(duckdb::unique_ptr<duckdb::Expression> &param) {
	bool is_empty = false;
	if (param->return_type.id() == LogicalTypeId::LIST) {
		auto empty_list = make_uniq<BoundConstantExpression>(Value::LIST(LogicalType::INTEGER, vector<Value>()));
		is_empty = param->Equals(*empty_list);
		if (!is_empty) {
			// if the param is not empty, the user has entered a list instead of a BIGINT
			throw BinderException("The upper and lower bounds of the slice must be a BIGINT");
		}
	}
	return is_empty;
}